

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O0

bool __thiscall tinyxml2::XMLDeclaration::ShallowEqual(XMLDeclaration *this,XMLNode *compare)

{
  long lVar1;
  char *p;
  char *q;
  long *in_RSI;
  XMLDeclaration *declaration;
  XMLNode *in_stack_ffffffffffffffc8;
  undefined1 local_19;
  
  lVar1 = (**(code **)(*in_RSI + 0x50))();
  local_19 = false;
  if (lVar1 != 0) {
    p = XMLNode::Value(in_stack_ffffffffffffffc8);
    q = XMLNode::Value(in_stack_ffffffffffffffc8);
    local_19 = XMLUtil::StringEqual(p,q,0x7fffffff);
  }
  return local_19;
}

Assistant:

bool XMLDeclaration::ShallowEqual( const XMLNode* compare ) const
{
    TIXMLASSERT( compare );
    const XMLDeclaration* declaration = compare->ToDeclaration();
    return ( declaration && XMLUtil::StringEqual( declaration->Value(), Value() ));
}